

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

bc_error_t * bc_error_new_printf(bc_error_type_t type,char *format,...)

{
  char in_AL;
  char *pcVar1;
  bc_error_t *pbVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (format == (char *)0x0) {
    pbVar2 = (bc_error_t *)bc_malloc(0x10);
    pbVar2->type = type;
    pcVar1 = bc_strdup("");
    pbVar2->msg = pcVar1;
  }
  else {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    pcVar1 = bc_strdup_vprintf(format,&local_e8);
    pbVar2 = (bc_error_t *)bc_malloc(0x10);
    pbVar2->type = type;
    pcVar3 = bc_strdup(pcVar1);
    pbVar2->msg = pcVar3;
    free(pcVar1);
  }
  return pbVar2;
}

Assistant:

bc_error_t*
bc_error_new_printf(bc_error_type_t type, const char *format, ...)
{
    if (format == NULL)
        return bc_error_new(type, "");
    va_list ap;
    va_start(ap, format);
    char *tmp = bc_strdup_vprintf(format, ap);
    va_end(ap);
    bc_error_t *rv = bc_error_new(type, tmp);
    free(tmp);
    return rv;
}